

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall helics::FilterFederate::handleMessage(FilterFederate *this,ActionMessage *command)

{
  TimeCoordinator *timeCoord;
  byte *pbVar1;
  action_t aVar2;
  pointer pGVar3;
  element_type *peVar4;
  GlobalHandle id;
  GlobalHandle targetId;
  GlobalHandle filt;
  pointer pGVar5;
  pointer pGVar6;
  FederateStates FVar7;
  bool bVar8;
  FilterInfo *pFVar9;
  char *__s;
  AirLock<std::any,_std::mutex,_std::condition_variable> *this_00;
  FilterCoordinator *this_01;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  _Var10;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *this_02;
  BasicHandleInfo *pBVar11;
  GlobalFederateId GVar12;
  GlobalHandle *target;
  pointer pGVar13;
  GlobalHandle *target_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> proc_result;
  shared_ptr<helics::FilterOperator> M;
  ActionMessage disconnect;
  string local_48;
  
  timeCoord = &this->mCoord;
  processCoordinatorMessage
            ((helics *)&proc_result,command,timeCoord,this->current_state,false,
             (GlobalFederateId)(this->mFedID).gid);
  FVar7 = this->current_state;
  if ((FVar7 == EXECUTING &
      (byte)proc_result.
            super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
            super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
            super__Tuple_impl<2UL,_bool>.super__Head_base<2UL,_bool,_false>._M_head_impl) == 1) {
    BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
    ActionMessage::ActionMessage(&disconnect,cmd_disconnect);
    disconnect.source_id.gid = (this->mFedID).gid;
    disconnect._16_8_ = (ulong)(uint)disconnect.dest_handle.hid << 0x20;
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              (&this->mQueueMessage,&disconnect);
    ActionMessage::~ActionMessage(&disconnect);
    FVar7 = this->current_state;
  }
  if (FVar7 != proc_result.
               super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>
               .super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl) {
    this->current_state =
         proc_result.
         super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
         super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl;
    if (proc_result.
        super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
        super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl == ERRORED) {
      disconnect._0_8_ = &disconnect.dest_id;
      disconnect.source_id.gid = 0;
      disconnect.source_handle.hid = 0;
      disconnect._16_8_ = disconnect._16_8_ & 0xffffffffffffff00;
      peVar4 = (element_type *)(command->payload).bufferSize;
      if (peVar4 == (element_type *)0x0) {
        __s = commandErrorString(0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&disconnect,
                   __s);
        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&disconnect,"unknown");
        if (bVar8) {
          CLI::std::__cxx11::to_string(&local_48,command->messageID);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M,
                         " code:",&local_48);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&disconnect,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M);
          std::__cxx11::string::~string((string *)&M);
          std::__cxx11::string::~string((string *)&local_48);
        }
      }
      else {
        M.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(command->payload).heap;
        M.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
        std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&disconnect,(basic_string_view<char,_std::char_traits<char>_> *)&M);
      }
      if ((this->mLogger).super__Function_base._M_manager != (_Manager_type)0x0) {
        __args_1._M_str = (this->mName)._M_dataplus._M_p;
        __args_1._M_len = (this->mName)._M_string_length;
        __args_2._M_str = (char *)disconnect._0_8_;
        __args_2._M_len._0_4_ = disconnect.source_id.gid;
        __args_2._M_len._4_4_ = disconnect.source_handle.hid;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(&this->mLogger,0,__args_1,__args_2);
      }
      std::__cxx11::string::~string((string *)&disconnect);
    }
    else if (proc_result.
             super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
             super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl == EXECUTING) {
      TimeCoordinator::timeRequest
                (timeCoord,(Time)0x7fffffffffffffff,NO_ITERATIONS,(Time)0x7fffffffffffffff,
                 (Time)0x7fffffffffffffff);
    }
    else if (proc_result.
             super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
             super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl == INITIALIZING) {
      TimeCoordinator::enteringExecMode(timeCoord,NO_ITERATIONS);
      ActionMessage::ActionMessage(&disconnect,cmd_exec_check);
      GVar12.gid = (this->mFedID).gid;
      disconnect.dest_id.gid = GVar12.gid;
      disconnect.source_id.gid = GVar12.gid;
      handleMessage(this,&disconnect);
      ActionMessage::~ActionMessage(&disconnect);
    }
  }
  if (proc_result.
      super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
      super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
      super__Head_base<1UL,_helics::MessageProcessingResult,_false>._M_head_impl !=
      CONTINUE_PROCESSING) {
    if (proc_result.
        super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
        super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
        super__Head_base<1UL,_helics::MessageProcessingResult,_false>._M_head_impl !=
        REPROCESS_MESSAGE) {
      return;
    }
    if ((command->dest_id).gid == (this->mFedID).gid) {
      handleMessage(this,command);
      return;
    }
    std::function<void_(const_helics::ActionMessage_&)>::operator()(&this->mSendMessage,command);
    return;
  }
  aVar2 = command->messageAction;
  if (aVar2 == cmd_disconnect) {
    if (this->usingGlobalTime != false) {
      return;
    }
    bVar8 = BaseTimeCoordinator::hasActiveTimeDependencies(&timeCoord->super_BaseTimeCoordinator);
    if (bVar8) {
      return;
    }
    BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
    ActionMessage::ActionMessage(&disconnect,cmd_disconnect);
    disconnect.source_id.gid = (this->mFedID).gid;
    disconnect._16_8_ = disconnect._16_8_ & 0xffffffff00000000;
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              (&this->mQueueMessage,&disconnect);
LAB_002ab9dc:
    ActionMessage::~ActionMessage(&disconnect);
  }
  else {
    if (aVar2 == cmd_add_endpoint) {
      pFVar9 = getFilterInfo(this,(GlobalFederateId)(this->mFedID).gid,
                             (InterfaceHandle)(command->dest_handle).hid);
      if (pFVar9 != (FilterInfo *)0x0) {
        if ((command->flags & 2) == 0) {
          this_02 = &pFVar9->sourceTargets;
        }
        else {
          this_02 = &pFVar9->destTargets;
        }
        disconnect.messageAction = (command->source_id).gid;
        disconnect.messageID = (command->source_handle).hid;
        std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::
        emplace_back<helics::GlobalHandle>(this_02,(GlobalHandle *)&disconnect);
        if (((command->flags & 0x10) == 0) && (this->usingGlobalTime == false)) {
          GVar12.gid = (command->source_id).gid;
LAB_002aba14:
          TimeCoordinator::addDependency(timeCoord,GVar12);
        }
      }
    }
    else {
      if (aVar2 != cmd_reg_end) {
        if (aVar2 == cmd_remove_filter) {
          this_01 = getFilterCoordinator(this,(InterfaceHandle)(command->dest_handle).hid);
          if (this_01 == (FilterCoordinator *)0x0) {
            return;
          }
          filt.fed_id.gid = (command->source_id).gid;
          filt.handle.hid = (command->source_handle).hid;
          FilterCoordinator::closeFilter(this_01,filt);
          return;
        }
        if (aVar2 == cmd_remove_endpoint) {
          id.fed_id.gid = (command->dest_id).gid;
          id.handle.hid = (command->dest_handle).hid;
          pFVar9 = getFilterInfo(this,id);
          if (pFVar9 == (FilterInfo *)0x0) {
            return;
          }
          targetId.fed_id.gid = (command->source_id).gid;
          targetId.handle.hid = (command->source_handle).hid;
          FilterInfo::removeTarget(pFVar9,targetId);
          return;
        }
        if (aVar2 == cmd_core_configure) {
          if (command->messageID != 0x23c) {
            return;
          }
          pFVar9 = getFilterInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                 (InterfaceHandle)(command->source_handle).hid);
          if (pFVar9 == (FilterInfo *)0x0) {
            return;
          }
          this_00 = std::
                    function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
                    ::operator()(&this->mGetAirLock,(uint)command->counter);
          gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                    ((optional<std::any> *)&disconnect,this_00);
          if ((char)disconnect.dest_id.gid == '\x01') {
            std::any_cast<std::shared_ptr<helics::FilterOperator>>((any *)&M);
            std::__shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(pFVar9->filterOp).
                        super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>,
                       &M.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &M.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::_Optional_payload_base<std::any>::_M_reset
                    ((_Optional_payload_base<std::any> *)&disconnect);
          return;
        }
        if (aVar2 == cmd_reg_filter) {
          processFilterInfo(this,command);
          return;
        }
        if (aVar2 != cmd_close_interface) {
          return;
        }
        disconnect.messageAction = (command->source_id).gid;
        disconnect.messageID = (command->source_handle).hid;
        pFVar9 = gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::
                 find(&this->filters,(GlobalHandle *)&disconnect);
        if (pFVar9 == (FilterInfo *)0x0) {
          return;
        }
        ActionMessage::ActionMessage(&disconnect,cmd_remove_filter);
        disconnect.source_id.gid = (pFVar9->core_id).gid;
        disconnect.source_handle.hid = (pFVar9->handle).hid;
        pGVar3 = (pFVar9->sourceTargets).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pGVar13 = (pFVar9->sourceTargets).
                       super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start; pGVar13 != pGVar3;
            pGVar13 = pGVar13 + 1) {
          disconnect._16_8_ = *pGVar13;
          std::function<void_(const_helics::ActionMessage_&)>::operator()
                    (&this->mSendMessage,&disconnect);
        }
        pGVar13 = (pFVar9->destTargets).
                  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pGVar3 = (pFVar9->destTargets).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          pGVar5 = (pFVar9->sourceTargets).
                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pGVar6 = (pFVar9->sourceTargets).
                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pGVar13 == pGVar3) break;
          _Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<helics::GlobalHandle*,std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>>,__gnu_cxx::__ops::_Iter_equals_val<helics::GlobalHandle_const>>
                             (pGVar5,pGVar6,pGVar13);
          if (_Var10._M_current !=
              (pFVar9->sourceTargets).
              super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            disconnect._16_8_ = *pGVar13;
            std::function<void_(const_helics::ActionMessage_&)>::operator()
                      (&this->mSendMessage,&disconnect);
          }
          pGVar13 = pGVar13 + 1;
        }
        if (pGVar6 != pGVar5) {
          (pFVar9->sourceTargets).
          super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
          super__Vector_impl_data._M_finish = pGVar5;
        }
        pGVar13 = (pFVar9->destTargets).
                  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pFVar9->destTargets).
            super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
            super__Vector_impl_data._M_finish != pGVar13) {
          (pFVar9->destTargets).
          super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
          super__Vector_impl_data._M_finish = pGVar13;
        }
        pbVar1 = (byte *)((long)&pFVar9->flags + 1);
        *pbVar1 = *pbVar1 | 0x10;
        goto LAB_002ab9dc;
      }
      pFVar9 = getFilterInfo(this,(GlobalFederateId)(this->mFedID).gid,
                             (InterfaceHandle)(command->dest_handle).hid);
      if (pFVar9 != (FilterInfo *)0x0) {
        std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
        emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle&>
                  ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                   &pFVar9->sourceTargets,&command->source_id,&command->source_handle);
        if (this->usingGlobalTime == false) {
          GVar12.gid = (command->source_id).gid;
          goto LAB_002aba14;
        }
      }
    }
    pBVar11 = HandleManager::getInterfaceHandle
                        (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,FILTER);
    if (pBVar11 != (BasicHandleInfo *)0x0) {
      pBVar11->used = true;
    }
  }
  return;
}

Assistant:

void FilterFederate::handleMessage(ActionMessage& command)
{
    auto proc_result = processCoordinatorMessage(command, &mCoord, current_state, false, mFedID);

    if (std::get<2>(proc_result) && current_state == FederateStates::EXECUTING) {
        mCoord.disconnect();
        ActionMessage disconnect(CMD_DISCONNECT);
        disconnect.source_id = mFedID;
        disconnect.dest_id = parent_broker_id;
        mQueueMessage(disconnect);
    }
    if (current_state != std::get<0>(proc_result)) {
        current_state = std::get<0>(proc_result);
        switch (current_state) {
            case FederateStates::INITIALIZING:
                mCoord.enteringExecMode(IterationRequest::NO_ITERATIONS);
                {
                    ActionMessage echeck{CMD_EXEC_CHECK};
                    echeck.dest_id = mFedID;
                    echeck.source_id = mFedID;
                    handleMessage(echeck);
                }
                break;
            case FederateStates::EXECUTING:
                mCoord.timeRequest(cBigTime, IterationRequest::NO_ITERATIONS, cBigTime, cBigTime);
                break;
            case FederateStates::FINISHED:
                break;
            case FederateStates::ERRORED: {
                std::string errorString;
                if (command.payload.empty()) {
                    errorString = commandErrorString(command.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(command.messageID);
                    }
                } else {
                    errorString = command.payload.to_string();
                }
                if (mLogger) {
                    mLogger(HELICS_LOG_LEVEL_ERROR, mName, errorString);
                }
            } break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (command.dest_id != mFedID) {
                mSendMessage(command);
                return;
            }
            return handleMessage(command);
        case MessageProcessingResult::DELAY_MESSAGE:
        default:
            return;
    }
    switch (command.action()) {
        case CMD_CLOSE_INTERFACE: {
            auto* filt = filters.find(command.getSource());
            if (filt != nullptr) {
                ActionMessage rem(CMD_REMOVE_FILTER);
                rem.source_handle = filt->handle;
                rem.source_id = filt->core_id;
                for (auto& target : filt->sourceTargets) {
                    rem.setDestination(target);
                    mSendMessage(rem);
                }
                for (auto& target : filt->destTargets) {
                    if (std::find(filt->sourceTargets.begin(), filt->sourceTargets.end(), target) !=
                        filt->sourceTargets.end()) {
                        rem.setDestination(target);
                        mSendMessage(rem);
                    }
                }
                filt->sourceTargets.clear();
                filt->destTargets.clear();
                setActionFlag(*filt, disconnected_flag);
            }
        } break;
        case CMD_REMOVE_FILTER: {
            auto* filterC = getFilterCoordinator(command.dest_handle);
            if (filterC == nullptr) {
                return;
            }
            filterC->closeFilter(command.getSource());
        } break;
        case CMD_REMOVE_ENDPOINT: {
            auto* filtI = getFilterInfo(command.getDest());
            if (filtI != nullptr) {
                filtI->removeTarget(command.getSource());
            }
        } break;
        case CMD_REG_ENDPOINT: {
            auto* filtI = getFilterInfo(mFedID, command.dest_handle);
            if (filtI != nullptr) {
                filtI->sourceTargets.emplace_back(command.source_id, command.source_handle);
                if (!usingGlobalTime) {
                    mCoord.addDependency(command.source_id);
                }
            }
            auto* filthandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::FILTER);
            if (filthandle != nullptr) {
                filthandle->used = true;
            }
        } break;
        case CMD_DISCONNECT:
            if (!usingGlobalTime && !mCoord.hasActiveTimeDependencies()) {
                mCoord.disconnect();
                ActionMessage disconnect(CMD_DISCONNECT);
                disconnect.source_id = mFedID;
                disconnect.dest_id = parent_broker_id;
                mQueueMessage(disconnect);
            }
            break;
        case CMD_REG_FILTER:
            processFilterInfo(command);
            break;
        case CMD_ADD_ENDPOINT: {
            auto* filtI = getFilterInfo(mFedID, command.dest_handle);
            if (filtI != nullptr) {
                if (checkActionFlag(command, destination_target)) {
                    filtI->destTargets.emplace_back(command.getSource());
                } else {
                    filtI->sourceTargets.emplace_back(command.getSource());
                }
                if (!checkActionFlag(command, error_flag)) {
                    if (!usingGlobalTime) {
                        mCoord.addDependency(command.source_id);
                    }
                }
            }

            auto* filthandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::FILTER);
            if (filthandle != nullptr) {
                filthandle->used = true;
            }
        } break;
        case CMD_CORE_CONFIGURE:
            if (command.messageID == UPDATE_FILTER_OPERATOR) {
                auto* filtI = getFilterInfo(mFedID, command.source_handle);
                if (filtI != nullptr) {
                    auto op = mGetAirLock(command.counter).try_unload();
                    if (op) {
                        auto M = std::any_cast<std::shared_ptr<FilterOperator>>(std::move(*op));
                        filtI->filterOp = std::move(M);
                    }
                }
            }
            break;
        default:
            break;
    }
}